

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O2

void oonf_viewer_output_prepare
               (oonf_viewer_template *template,abuf_template_storage *storage,autobuf *out,
               char *format)

{
  json_session *session;
  char *format_00;
  
  template->out = out;
  if (template->create_json == true) {
    template->_storage = (abuf_template_storage *)0x0;
    session = &template->_json;
    json_init_session(session,out);
    if (template->create_only_data == false) {
      json_start_object(session,(char *)0x0);
    }
    json_start_array(session,template->json_name);
    return;
  }
  format_00 = (char *)0x0;
  if ((format != (char *)0x0) && (*format != '\0')) {
    format_00 = format;
  }
  template->_storage = storage;
  abuf_template_init_ext(storage,template->data,template->data_size,format_00);
  return;
}

Assistant:

void
oonf_viewer_output_prepare(struct oonf_viewer_template *template, struct abuf_template_storage *storage,
  struct autobuf *out, const char *format) {
  template->out = out;

  if (template->create_json) {
    /* JSON format */
    template->_storage = NULL;
    json_init_session(&template->_json, out);

    /* start wrapper object */
    if (!template->create_only_data) {
      json_start_object(&template->_json, NULL);
    }

    /* start object with array */
    json_start_array(&template->_json, template->json_name);
  }
  else {
    if (format && *format == 0) {
      format = NULL;
    }

    /* no JSON format, generate template entries */
    template->_storage = storage;
    abuf_template_init_ext(template->_storage, template->data, template->data_size, format);
  }
}